

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedKnapsackCover()::__0>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> a,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> c,
               anon_class_8_1_8991fb9c comp)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  int __tmp_1;
  int iVar4;
  int __tmp;
  double dVar5;
  
  iVar4 = *b._M_current;
  iVar2 = *a._M_current;
  pdVar3 = (comp.this)->vals;
  dVar5 = pdVar3[iVar4];
  dVar1 = pdVar3[iVar2];
  if (dVar1 < dVar5) {
    *a._M_current = iVar4;
    *b._M_current = iVar2;
    dVar5 = dVar1;
    iVar4 = iVar2;
  }
  if (dVar5 < pdVar3[*c._M_current]) {
    *b._M_current = *c._M_current;
    *c._M_current = iVar4;
    iVar4 = *b._M_current;
  }
  iVar2 = *a._M_current;
  if (pdVar3[iVar2] <= pdVar3[iVar4] && pdVar3[iVar4] != pdVar3[iVar2]) {
    *a._M_current = iVar4;
    *b._M_current = iVar2;
  }
  return;
}

Assistant:

inline void sort2(Iter a, Iter b, Compare comp) {
        if (comp(*b, *a)) std::iter_swap(a, b);
    }